

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

void __thiscall cimg_library::CImgDisplay::_paint(CImgDisplay *this,bool wait_expose)

{
  Display *pDVar1;
  X11_info *pXVar2;
  
  if ((this->_is_closed == false) && (this->_image != (XImage *)0x0)) {
    pXVar2 = cimg::X11_attr();
    pDVar1 = pXVar2->display;
    if (wait_expose) {
      XSendEvent(pDVar1,this->_window,0,0);
    }
    else {
      XPutImage(pDVar1,this->_window,
                *(undefined8 *)
                 (*(long *)(pDVar1 + 0xe8) + 0x48 + (long)*(int *)(pDVar1 + 0xe0) * 0x80),
                this->_image,0,0,0,0,this->_width,this->_height);
    }
  }
  return;
}

Assistant:

void _paint(const bool wait_expose=true) {
      if (_is_closed || !_image) return;
      Display *const dpy = cimg::X11_attr().display;
      if (wait_expose) { // Send an expose event sticked to display window to force repaint.
        XEvent event;
        event.xexpose.type = Expose;
        event.xexpose.serial = 0;
        event.xexpose.send_event = 1;
        event.xexpose.display = dpy;
        event.xexpose.window = _window;
        event.xexpose.x = 0;
        event.xexpose.y = 0;
        event.xexpose.width = width();
        event.xexpose.height = height();
        event.xexpose.count = 0;
        XSendEvent(dpy,_window,0,0,&event);
      } else { // Repaint directly (may be called from the expose event).
        GC gc = DefaultGC(dpy,DefaultScreen(dpy));
#ifdef cimg_use_xshm
        if (_shminfo) XShmPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height,1);
        else XPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height);
#else
        XPutImage(dpy,_window,gc,_image,0,0,0,0,_width,_height);
#endif
      }
    }